

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::EqExp(SQCompiler *this)

{
  long lVar1;
  long *in_RDI;
  SQOpcode in_stack_0000000c;
  SQCompiler *in_stack_00000010;
  SQCompiler *in_stack_00000020;
  SQInteger in_stack_fffffffffffffff0;
  long *f;
  
  f = in_RDI;
  CompExp(in_stack_00000020);
  while( true ) {
    while( true ) {
      while (lVar1 = *in_RDI, lVar1 == 0x108) {
        in_stack_fffffffffffffff0 = 0;
        BIN_EXP<void(SQCompiler::*)()>
                  (in_stack_00000010,in_stack_0000000c,(offset_in_SQCompiler_to_subr)f,0);
      }
      if (lVar1 != 0x109) break;
      BIN_EXP<void(SQCompiler::*)()>
                (in_stack_00000010,in_stack_0000000c,(offset_in_SQCompiler_to_subr)f,
                 in_stack_fffffffffffffff0);
    }
    if (lVar1 != 0x131) break;
    BIN_EXP<void(SQCompiler::*)()>
              (in_stack_00000010,in_stack_0000000c,(offset_in_SQCompiler_to_subr)f,
               in_stack_fffffffffffffff0);
  }
  return;
}

Assistant:

void EqExp()
    {
        CompExp();
        for(;;) switch(_token) {
        case TK_EQ: BIN_EXP(_OP_EQ, &SQCompiler::CompExp); break;
        case TK_NE: BIN_EXP(_OP_NE, &SQCompiler::CompExp); break;
        case TK_3WAYSCMP: BIN_EXP(_OP_CMP, &SQCompiler::CompExp,CMP_3W); break;
        default: return;
        }
    }